

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmitterSystem::Encode(EmitterSystem *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EmitterName);
  KDataStream::Write(stream,this->m_ui8Function);
  KDataStream::Write(stream,this->m_ui8EmitterIDNumber);
  return;
}

Assistant:

void EmitterSystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16EmitterName
           << m_ui8Function
           << m_ui8EmitterIDNumber;
}